

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_binder.cpp
# Opt level: O3

void __thiscall
duckdb::TableFunctionBinder::TableFunctionBinder
          (TableFunctionBinder *this,Binder *binder,ClientContext *context,
          string *table_function_name_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  ExpressionBinder::ExpressionBinder(&this->super_ExpressionBinder,binder,context,false);
  (this->super_ExpressionBinder)._vptr_ExpressionBinder =
       (_func_int **)&PTR__TableFunctionBinder_0244ceb0;
  paVar1 = &(this->table_function_name).field_2;
  (this->table_function_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (table_function_name_p->_M_dataplus)._M_p;
  paVar2 = &table_function_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&table_function_name_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->table_function_name).field_2 + 8) = uVar4;
  }
  else {
    (this->table_function_name)._M_dataplus._M_p = pcVar3;
    (this->table_function_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->table_function_name)._M_string_length = table_function_name_p->_M_string_length;
  (table_function_name_p->_M_dataplus)._M_p = (pointer)paVar2;
  table_function_name_p->_M_string_length = 0;
  (table_function_name_p->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

TableFunctionBinder::TableFunctionBinder(Binder &binder, ClientContext &context, string table_function_name_p)
    : ExpressionBinder(binder, context), table_function_name(std::move(table_function_name_p)) {
}